

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileInstaller.cxx
# Opt level: O1

bool __thiscall cmFileInstaller::CheckKeyword(cmFileInstaller *this,string *arg)

{
  cmCommand *this_00;
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  ostringstream e;
  string local_1b0;
  undefined1 local_190 [376];
  
  iVar2 = std::__cxx11::string::compare((char *)arg);
  if (iVar2 == 0) {
    if ((this->super_cmFileCopier).CurrentMatchRule == (MatchRule *)0x0) {
      (this->super_cmFileCopier).Doing = 10;
      return true;
    }
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)arg);
    if (iVar2 == 0) {
      if ((this->super_cmFileCopier).CurrentMatchRule == (MatchRule *)0x0) {
        (this->super_cmFileCopier).Doing = 4;
        return true;
      }
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)arg);
      if (iVar2 == 0) {
        if ((this->super_cmFileCopier).CurrentMatchRule == (MatchRule *)0x0) {
          (this->super_cmFileCopier).Doing = 0xb;
          return true;
        }
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)arg);
        if (iVar2 == 0) {
          if ((this->super_cmFileCopier).CurrentMatchRule == (MatchRule *)0x0) {
            (this->super_cmFileCopier).Doing = 0;
            this->Optional = true;
            return true;
          }
        }
        else {
          iVar2 = std::__cxx11::string::compare((char *)arg);
          if (iVar2 == 0) {
            if ((this->super_cmFileCopier).CurrentMatchRule == (MatchRule *)0x0) {
              (this->super_cmFileCopier).Doing = 0;
              this->MessageAlways = true;
              return true;
            }
          }
          else {
            iVar2 = std::__cxx11::string::compare((char *)arg);
            if (iVar2 == 0) {
              if ((this->super_cmFileCopier).CurrentMatchRule == (MatchRule *)0x0) {
                (this->super_cmFileCopier).Doing = 0;
                this->MessageLazy = true;
                return true;
              }
            }
            else {
              iVar2 = std::__cxx11::string::compare((char *)arg);
              if (iVar2 == 0) {
                if ((this->super_cmFileCopier).CurrentMatchRule == (MatchRule *)0x0) {
                  (this->super_cmFileCopier).Doing = 0;
                  this->MessageNever = true;
                  return true;
                }
              }
              else {
                iVar2 = std::__cxx11::string::compare((char *)arg);
                if (iVar2 == 0) {
                  if ((this->super_cmFileCopier).CurrentMatchRule != (MatchRule *)0x0) {
                    (this->super_cmFileCopier).Doing = 9;
                    return true;
                  }
                  (this->super_cmFileCopier).Doing = 7;
                  (this->super_cmFileCopier).UseGivenPermissionsFile = true;
                  return true;
                }
                iVar2 = std::__cxx11::string::compare((char *)arg);
                if (iVar2 != 0) {
                  iVar2 = std::__cxx11::string::compare((char *)arg);
                  if (((iVar2 != 0) &&
                      (iVar2 = std::__cxx11::string::compare((char *)arg), iVar2 != 0)) &&
                     (iVar2 = std::__cxx11::string::compare((char *)arg), iVar2 != 0)) {
                    bVar1 = cmFileCopier::CheckKeyword(&this->super_cmFileCopier,arg);
                    return bVar1;
                  }
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_190,"INSTALL called with old-style ",0x1e);
                  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                                     ((ostream *)local_190,(arg->_M_dataplus)._M_p,
                                      arg->_M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar3," argument.  ",0xc);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar3,"This script was generated with an older version of CMake.  ",
                             0x3b);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar3,"Re-run this cmake version on your build tree.",0x2d);
                  this_00 = &((this->super_cmFileCopier).FileCommand)->super_cmCommand;
                  std::__cxx11::stringbuf::str();
                  cmCommand::SetError(this_00,&local_1b0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
                    operator_delete(local_1b0._M_dataplus._M_p,
                                    local_1b0.field_2._M_allocated_capacity + 1);
                  }
                  (this->super_cmFileCopier).Doing = 1;
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
                  std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
                  return true;
                }
                if ((this->super_cmFileCopier).CurrentMatchRule == (MatchRule *)0x0) {
                  (this->super_cmFileCopier).Doing = 8;
                  (this->super_cmFileCopier).UseGivenPermissionsDir = true;
                  return true;
                }
              }
            }
          }
        }
      }
    }
  }
  cmFileCopier::NotAfterMatch(&this->super_cmFileCopier,arg);
  return true;
}

Assistant:

bool cmFileInstaller::CheckKeyword(std::string const& arg)
{
  if (arg == "TYPE") {
    if (this->CurrentMatchRule) {
      this->NotAfterMatch(arg);
    } else {
      this->Doing = DoingType;
    }
  } else if (arg == "FILES") {
    if (this->CurrentMatchRule) {
      this->NotAfterMatch(arg);
    } else {
      this->Doing = DoingFiles;
    }
  } else if (arg == "RENAME") {
    if (this->CurrentMatchRule) {
      this->NotAfterMatch(arg);
    } else {
      this->Doing = DoingRename;
    }
  } else if (arg == "OPTIONAL") {
    if (this->CurrentMatchRule) {
      this->NotAfterMatch(arg);
    } else {
      this->Doing = DoingNone;
      this->Optional = true;
    }
  } else if (arg == "MESSAGE_ALWAYS") {
    if (this->CurrentMatchRule) {
      this->NotAfterMatch(arg);
    } else {
      this->Doing = DoingNone;
      this->MessageAlways = true;
    }
  } else if (arg == "MESSAGE_LAZY") {
    if (this->CurrentMatchRule) {
      this->NotAfterMatch(arg);
    } else {
      this->Doing = DoingNone;
      this->MessageLazy = true;
    }
  } else if (arg == "MESSAGE_NEVER") {
    if (this->CurrentMatchRule) {
      this->NotAfterMatch(arg);
    } else {
      this->Doing = DoingNone;
      this->MessageNever = true;
    }
  } else if (arg == "PERMISSIONS") {
    if (this->CurrentMatchRule) {
      this->Doing = DoingPermissionsMatch;
    } else {
      // file(INSTALL) aliases PERMISSIONS to FILE_PERMISSIONS
      this->Doing = DoingPermissionsFile;
      this->UseGivenPermissionsFile = true;
    }
  } else if (arg == "DIR_PERMISSIONS") {
    if (this->CurrentMatchRule) {
      this->NotAfterMatch(arg);
    } else {
      // file(INSTALL) aliases DIR_PERMISSIONS to DIRECTORY_PERMISSIONS
      this->Doing = DoingPermissionsDir;
      this->UseGivenPermissionsDir = true;
    }
  } else if (arg == "COMPONENTS" || arg == "CONFIGURATIONS" ||
             arg == "PROPERTIES") {
    std::ostringstream e;
    e << "INSTALL called with old-style " << arg << " argument.  "
      << "This script was generated with an older version of CMake.  "
      << "Re-run this cmake version on your build tree.";
    this->FileCommand->SetError(e.str());
    this->Doing = DoingError;
  } else {
    return this->cmFileCopier::CheckKeyword(arg);
  }
  return true;
}